

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O2

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_conicto
              (FT_Vector *control,FT_Vector *to,void *closure)

{
  bool bVar1;
  
  bVar1 = FTConicto((IOutlineEnumerator *)closure,control,to);
  return (int)!bVar1;
}

Assistant:

int FreeTypeFaceWrapper::IOutlineEnumerator::outline_conicto(const FT_Vector *control, const FT_Vector *to, void *closure) //static
{
	return ( (FreeTypeFaceWrapper::IOutlineEnumerator *)closure )->FTConicto(control, to) ? 0 : 1;
}